

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O1

string * __thiscall
flatbuffers::rust::RustGenerator::NamespacedNativeName_abi_cxx11_
          (string *__return_storage_ptr__,RustGenerator *this,EnumDef *def)

{
  Namespace *ns;
  string local_40;
  
  ns = (def->super_Definition).defined_namespace;
  (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_40,&this->namer_);
  WrapInNameSpace(__return_storage_ptr__,this,ns,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NamespacedNativeName(const EnumDef &def) {
    return WrapInNameSpace(def.defined_namespace, namer_.ObjectType(def));
  }